

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

MaxLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::MaxLayerParams>(Arena *arena)

{
  MaxLayerParams *pMVar1;
  
  if (arena != (Arena *)0x0) {
    pMVar1 = DoCreateMessage<CoreML::Specification::MaxLayerParams>(arena);
    return pMVar1;
  }
  pMVar1 = (MaxLayerParams *)operator_new(0x18);
  CoreML::Specification::MaxLayerParams::MaxLayerParams(pMVar1,(Arena *)0x0,false);
  return pMVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }